

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorBG.cpp
# Opt level: O0

AlphaVector * __thiscall
AlphaVectorBG::BeliefBackup
          (AlphaVectorBG *this,JointBeliefInterface *b,Index a,GaoVectorSet *G,
          ValueFunctionPOMDPDiscrete *V,BGBackupType type)

{
  allocator<char> *__s;
  long *in_RDX;
  allocator<char> *in_RSI;
  AlphaVector *in_RDI;
  int in_stack_00000008;
  AlphaVector *alpha;
  Index in_stack_0000015c;
  undefined4 in_stack_00000164;
  AlphaVectorBG *in_stack_00000168;
  ValueFunctionPOMDPDiscrete *in_stack_000001b8;
  GaoVectorSet *in_stack_000001c0;
  Index in_stack_000001cc;
  JointBeliefInterface *in_stack_000001d0;
  AlphaVectorBG *in_stack_000001d8;
  BGBackupType in_stack_000001f0;
  int in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  AlphaVector *in_stack_fffffffffffffeb0;
  AlphaVector *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  AlphaVector *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_101;
  string local_100 [155];
  undefined1 local_65;
  undefined1 local_51 [57];
  long *local_18;
  
  __s = in_RSI + *(long *)(*(long *)in_RSI + -0x18);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_51;
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,in_RSI);
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)in_stack_fffffffffffffeb0,
             (string *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  local_65 = 0;
  (**(code **)(*(long *)((long)local_18 + *(long *)(*local_18 + -0xb8)) + 0x70))
            ((long)local_18 + *(long *)(*local_18 + -0xb8));
  AlphaVector::AlphaVector(this_00,CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  if (in_stack_00000008 == 0) {
    BeliefBackupExhaustiveOnlyKeepMax
              (in_stack_00000168,(JointBeliefInterface *)CONCAT44(in_stack_00000164,type),
               in_stack_0000015c,(GaoVectorSet *)alpha,(ValueFunctionPOMDPDiscrete *)this);
    AlphaVector::operator=(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    AlphaVector::~AlphaVector((AlphaVector *)0x92afeb);
  }
  else if (in_stack_00000008 == 1) {
    BeliefBackupExhaustiveStoreAll(this,b,a,G,V);
    AlphaVector::operator=(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    AlphaVector::~AlphaVector((AlphaVector *)0x92b083);
  }
  else if (in_stack_00000008 - 2U < 4) {
    BeliefBackupBGIP_Solver
              (in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c0,
               in_stack_000001b8,in_stack_000001f0);
    AlphaVector::operator=(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    AlphaVector::~AlphaVector((AlphaVector *)0x92b105);
    in_stack_fffffffffffffea8 = in_stack_00000008;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,in_RSI);
  TimedAlgorithm::StopTimer
            ((TimedAlgorithm *)in_stack_fffffffffffffeb0,
             (string *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  return in_RDI;
}

Assistant:

AlphaVector
AlphaVectorBG::BeliefBackup(const JointBeliefInterface &b,
                            Index a,
                            const GaoVectorSet &G,
                            const ValueFunctionPOMDPDiscrete &V,
                            BGBackupType type) const
{
#if DEBUG_AlphaVectorBG_BeliefBackup
    tms timeStruct;
    clock_t ticks_before, ticks_after;
    ticks_before = times(&timeStruct);
#endif

    StartTimer("BeliefBackupBG");

    AlphaVector alpha(b.Size());
    switch(type)
    {
    case EXHAUSTIVE_ONLYKEEPMAX:
        alpha=BeliefBackupExhaustiveOnlyKeepMax(b,a,G,V);
        break;
    case EXHAUSTIVE_STOREALL:
        alpha=BeliefBackupExhaustiveStoreAll(b,a,G,V);
        break;
    case BGIP_SOLVER_EXHAUSTIVE:
    case BGIP_SOLVER_ALTERNATINGMAXIMIZATION:
    case BGIP_SOLVER_ALTERNATINGMAXIMIZATION_100STARTS:
    case BGIP_SOLVER_BRANCH_AND_BOUND:
        alpha=BeliefBackupBGIP_Solver(b,a,G,V,type);
        break;
    }

    StopTimer("BeliefBackupBG");

#if DEBUG_AlphaVectorBG_BeliefBackup
    ticks_after = times(&timeStruct);
    cout << "AlphaVectorBG::BeliefBackup backuptype " << type
         << " done in " 
         << ticks_after - ticks_before << " clock ticks, "
         << static_cast<double>((ticks_after - ticks_before))
        / sysconf(_SC_CLK_TCK) 
         << "s" << endl;
#endif

#if DEBUG_AlphaVectorBG_CheckBGIP_SolverExhaustive
    if(type==BGIP_SOLVER_EXHAUSTIVE)
    {
        AlphaVector alphaOK=BeliefBackup(b,a,G,V,EXHAUSTIVE_ONLYKEEPMAX);
        if(!alphaOK.Equal(alpha))
            abort();
    }
#endif

    return(alpha);
}